

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

Var __thiscall Clasp::Solver::pushAuxVar(Solver *this)

{
  Var VVar1;
  DecisionHeuristic *pDVar2;
  left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *in_RDI;
  Var aux;
  undefined8 in_stack_ffffffffffffffa8;
  Solver *in_stack_ffffffffffffffb0;
  left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *in_stack_ffffffffffffffc8;
  size_type in_stack_ffffffffffffffd4;
  iterator in_stack_ffffffffffffffd8;
  pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
  *in_stack_ffffffffffffffe0;
  
  VVar1 = Assignment::addVar((Assignment *)in_stack_ffffffffffffffb0);
  setPref(in_stack_ffffffffffffffb0,(Var)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
          (Value)in_stack_ffffffffffffffa8,(ValueRep)((ulong)in_RDI >> 0x38));
  bk_lib::
  pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
  ::end((pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
         *)&in_RDI[0xf].super_type.super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
            field_0x8);
  bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>::left_right_sequence
            (in_RDI);
  bk_lib::
  pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
  ::insert(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
           in_stack_ffffffffffffffc8);
  bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>::~left_right_sequence
            ((left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *)0x1e850d);
  pDVar2 = SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject>::operator->
                     ((SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject> *)0x1e851b);
  (*pDVar2->_vptr_DecisionHeuristic[6])(pDVar2,in_RDI,(ulong)VVar1,1);
  return VVar1;
}

Assistant:

Var Solver::pushAuxVar() {
	assert(!lazyRem_);
	Var aux = assign_.addVar();
	setPref(aux, ValueSet::def_value, value_false);
	watches_.insert(watches_.end(), 2, WatchList());
	heuristic_->updateVar(*this, aux, 1);
	return aux;
}